

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_rep.cpp
# Opt level: O1

scfx_rep * sc_dt::div_scfx_rep(scfx_rep *lhs,scfx_rep *rhs,int div_wl)

{
  uint *puVar1;
  state sVar2;
  state sVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  scfx_rep *this;
  word *pwVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  scfx_rep_node *node;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  scfx_rep remainder;
  scfx_index x;
  scfx_rep local_68;
  scfx_index local_40;
  word *local_38;
  
  this = (scfx_rep *)scfx_rep::operator_new((scfx_rep *)0x28,(size_t)rhs);
  scfx_rep::scfx_rep(this);
  sVar2 = lhs->m_state;
  if (((sVar2 == not_a_number) || (sVar3 = rhs->m_state, sVar3 == not_a_number)) ||
     (sVar3 == infinity && sVar2 == infinity)) goto LAB_001c2aab;
  if (sVar2 == normal) {
    uVar11 = (ulong)(lhs->m_mant).m_size;
    bVar18 = (long)uVar11 < 1;
    if (0 < (long)uVar11) {
      pwVar7 = (lhs->m_mant).m_array;
      if (*pwVar7 == 0) {
        uVar4 = 1;
        do {
          uVar13 = uVar4;
          if (uVar11 == uVar13) break;
          uVar4 = uVar13 + 1;
        } while (pwVar7[uVar13] == 0);
        bVar18 = uVar11 <= uVar13;
      }
      else {
        bVar18 = false;
      }
    }
    if (bVar18 && sVar3 == normal) {
      uVar11 = (ulong)(rhs->m_mant).m_size;
      bVar18 = (long)uVar11 < 1;
      if (0 < (long)uVar11) {
        pwVar7 = (rhs->m_mant).m_array;
        if (*pwVar7 != 0) goto LAB_001c2b96;
        uVar4 = 1;
        do {
          uVar13 = uVar4;
          if (uVar11 == uVar13) break;
          uVar4 = uVar13 + 1;
        } while (pwVar7[uVar13] == 0);
        bVar18 = uVar11 <= uVar13;
      }
      if (bVar18) {
LAB_001c2aab:
        if ((this->m_mant).m_size != 4) {
          if ((this->m_mant).m_array == (word *)0x0) {
            (this->m_mant).m_size = 4;
            pwVar7 = scfx_mant::alloc_word(4);
            (this->m_mant).m_array = pwVar7;
          }
          else {
            pwVar7 = scfx_mant::alloc_word(4);
            scfx_mant::free_word((this->m_mant).m_array,(long)(this->m_mant).m_size);
            (this->m_mant).m_array = pwVar7;
            (this->m_mant).m_size = 4;
          }
        }
        this->m_state = not_a_number;
        return this;
      }
    }
  }
LAB_001c2b96:
  if (sVar2 == infinity) goto LAB_001c2b9b;
  if (sVar3 == normal) {
    uVar11 = (ulong)(rhs->m_mant).m_size;
    bVar18 = (long)uVar11 < 1;
    if (0 < (long)uVar11) {
      pwVar7 = (rhs->m_mant).m_array;
      if (*pwVar7 != 0) goto LAB_001c2be5;
      uVar4 = 1;
      do {
        uVar13 = uVar4;
        if (uVar11 == uVar13) break;
        uVar4 = uVar13 + 1;
      } while (pwVar7[uVar13] == 0);
      bVar18 = uVar11 <= uVar13;
    }
    if (bVar18) {
LAB_001c2b9b:
      iVar8 = rhs->m_sign;
      iVar14 = lhs->m_sign;
      if ((this->m_mant).m_size != 4) {
        if ((this->m_mant).m_array == (word *)0x0) {
          (this->m_mant).m_size = 4;
          pwVar7 = scfx_mant::alloc_word(4);
          (this->m_mant).m_array = pwVar7;
        }
        else {
          pwVar7 = scfx_mant::alloc_word(4);
          scfx_mant::free_word((this->m_mant).m_array,(long)(this->m_mant).m_size);
          (this->m_mant).m_array = pwVar7;
          (this->m_mant).m_size = 4;
        }
      }
      this->m_state = infinity;
      this->m_sign = iVar8 * iVar14;
      return this;
    }
  }
LAB_001c2be5:
  if (sVar2 == normal) {
    uVar11 = (ulong)(lhs->m_mant).m_size;
    bVar18 = (long)uVar11 < 1;
    if (0 < (long)uVar11) {
      pwVar7 = (lhs->m_mant).m_array;
      if (*pwVar7 == 0) {
        uVar4 = 1;
        do {
          uVar13 = uVar4;
          if (uVar11 == uVar13) break;
          uVar4 = uVar13 + 1;
        } while (pwVar7[uVar13] == 0);
        bVar18 = uVar11 <= uVar13;
      }
      else {
        bVar18 = false;
      }
    }
    if (sVar3 != infinity && !bVar18) goto LAB_001c2ce0;
  }
  else if (sVar3 != infinity) {
LAB_001c2ce0:
    iVar8 = div_wl + 0x3f;
    if (-1 < div_wl + 0x20) {
      iVar8 = div_wl + 0x20;
    }
    iVar14 = 3;
    if (3 < iVar8 >> 5) {
      iVar14 = iVar8 >> 5;
    }
    scfx_rep::resize_to(this,iVar14 + 1,0);
    if (0 < (this->m_mant).m_size) {
      pwVar7 = (this->m_mant).m_array;
      lVar12 = 0;
      do {
        pwVar7[lVar12] = 0;
        lVar12 = lVar12 + 1;
      } while (lVar12 < (this->m_mant).m_size);
    }
    this->m_sign = rhs->m_sign * lhs->m_sign;
    iVar5 = scfx_find_msb((ulong)(lhs->m_mant).m_array[lhs->m_msw]);
    iVar8 = lhs->m_msw;
    iVar14 = lhs->m_wp;
    iVar6 = scfx_find_msb((ulong)(rhs->m_mant).m_array[rhs->m_msw]);
    iVar8 = ((rhs->m_wp - rhs->m_msw) + (iVar8 - iVar14)) * 0x20;
    uVar10 = (iVar5 - iVar6) + iVar8;
    uVar9 = (iVar5 - iVar6) + 0x1f + iVar8;
    if (-1 < (int)uVar10) {
      uVar9 = uVar10;
    }
    uVar10 = uVar10 - (uVar9 & 0xffffffe0);
    iVar8 = ((int)~uVar10 >> 0x1f) + (this->m_mant).m_size;
    this->m_wp = iVar8 - ((int)uVar9 >> 5);
    scfx_rep::scfx_rep(&local_68,lhs);
    scfx_rep::lshift(&local_68,-uVar10);
    if (local_68.m_msw == local_68.m_mant.m_size + -1) {
      scfx_rep::resize_to(&local_68,local_68.m_mant.m_size + 1,1);
    }
    iVar14 = rhs->m_msw - local_68.m_msw;
    if (iVar14 != 0 && local_68.m_msw <= rhs->m_msw) {
      scfx_rep::resize_to(&local_68,iVar14 + local_68.m_mant.m_size,-1);
    }
    pwVar7 = local_68.m_mant.m_array;
    iVar14 = div_wl + 1;
    iVar8 = iVar8 * 0x20 + uVar10;
    if (iVar14 != 0) {
      local_38 = (rhs->m_mant).m_array;
      do {
        if (local_68.m_state == normal) {
          uVar11 = (ulong)local_68.m_mant.m_size;
          bVar18 = (long)uVar11 < 1;
          if (0 < (long)uVar11) {
            if (*pwVar7 != 0) goto LAB_001c2e64;
            uVar4 = 1;
            do {
              uVar13 = uVar4;
              if (uVar11 == uVar13) break;
              uVar4 = uVar13 + 1;
            } while (pwVar7[uVar13] == 0);
            bVar18 = uVar11 <= uVar13;
          }
          if (bVar18) goto LAB_001c2fdb;
        }
LAB_001c2e64:
        iVar5 = compare_msw_ff(rhs,&local_68);
        if (iVar5 < 1) {
          puVar1 = (this->m_mant).m_array + (iVar8 >> 5);
          *puVar1 = *puVar1 | 1 << ((byte)iVar8 & 0x1f);
          iVar5 = rhs->m_lsw;
          iVar6 = rhs->m_msw - iVar5;
          iVar15 = local_68.m_msw - iVar6;
          lVar12 = 0;
          uVar9 = 0;
          do {
            uVar17 = uVar9;
            uVar10 = pwVar7[iVar15 + lVar12];
            uVar9 = local_38[iVar5 + lVar12];
            uVar16 = uVar9 + uVar17;
            pwVar7[iVar15 + lVar12] = uVar10 - uVar16;
            lVar12 = lVar12 + 1;
            uVar9 = (uint)CARRY4(uVar9,uVar17) + (uint)(uVar10 < uVar16);
          } while (iVar6 + 1 != (int)lVar12);
          if ((uVar16 < uVar17) || (uVar10 < uVar16)) {
            pwVar7[(long)local_68.m_msw + 1] = 0;
          }
        }
        if (1 < (long)local_68.m_mant.m_size) {
          lVar12 = (long)local_68.m_mant.m_size + 1;
          do {
            pwVar7[lVar12 + -2] = pwVar7[lVar12 + -2] << 1 | pwVar7[lVar12 + -3] >> 0x1f;
            lVar12 = lVar12 + -1;
          } while (2 < lVar12);
        }
        *pwVar7 = *pwVar7 << 1;
        local_68.m_lsw = 0;
        if (0 < (long)local_68.m_mant.m_size) {
          lVar12 = 0;
          do {
            if (pwVar7[lVar12] != 0) {
              local_68.m_lsw = (int)lVar12;
              break;
            }
            lVar12 = lVar12 + 1;
          } while (local_68.m_mant.m_size != lVar12);
        }
        iVar8 = iVar8 + -1;
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
    iVar14 = this->m_wp;
    iVar8 = iVar8 + iVar14 * -0x20;
    uVar9 = iVar8 + 1;
    uVar10 = iVar8 + 0x20;
    if (-1 < (int)uVar9) {
      uVar10 = uVar9;
    }
    iVar5 = (iVar8 - (uVar10 & 0xffffffe0)) + 1;
    local_40 = (scfx_index)
               (CONCAT44(iVar5,((int)uVar10 >> 5) + iVar14 + (iVar5 >> 0x1f)) & 0x1fffffffff);
    pwVar7 = (this->m_mant).m_array;
    if ((pwVar7[local_40.m_wi] >> local_40.m_bi & 1) != 0) {
      uVar10 = iVar8 + 0x21;
      if (-1 < (int)(iVar8 + 2U)) {
        uVar10 = iVar8 + 2U;
      }
      uVar9 = (uVar9 - (uVar10 & 0xffffffe0)) + 1;
      if ((pwVar7[((int)uVar10 >> 5) + iVar14 + ((int)uVar9 >> 0x1f)] >> (uVar9 & 0x1f) & 1) != 0) {
        scfx_rep::q_incr(this,&local_40);
      }
    }
    this->m_r_flag = true;
LAB_001c2fdb:
    scfx_rep::find_sw(this);
    if (local_68.m_mant.m_array == (word *)0x0) {
      return this;
    }
    scfx_mant::free_word(local_68.m_mant.m_array,(long)local_68.m_mant.m_size);
    return this;
  }
  iVar8 = rhs->m_sign;
  iVar14 = lhs->m_sign;
  if (0 < (this->m_mant).m_size) {
    pwVar7 = (this->m_mant).m_array;
    lVar12 = 0;
    do {
      pwVar7[lVar12] = 0;
      lVar12 = lVar12 + 1;
    } while (lVar12 < (this->m_mant).m_size);
  }
  this->m_lsw = 0;
  this->m_wp = 0;
  this->m_sign = iVar8 * iVar14;
  this->m_state = normal;
  this->m_msw = 0;
  return this;
}

Assistant:

scfx_rep*
div_scfx_rep( const scfx_rep& lhs, const scfx_rep& rhs, int div_wl )
{
    scfx_rep& result = *new scfx_rep;

    //
    // check for special cases
    //

    if( lhs.is_nan() || rhs.is_nan() || (lhs.is_inf() && rhs.is_inf()) ||
	(lhs.is_zero() && rhs.is_zero()) )
    {
	result.set_nan();
	return &result;
    }

    if( lhs.is_inf() || rhs.is_zero() )
    {
	result.set_inf( lhs.m_sign * rhs.m_sign );
	return &result;
    }

    if( lhs.is_zero() || rhs.is_inf() )
    {
	result.set_zero( lhs.m_sign * rhs.m_sign );
	return &result;
    }

    //
    // do it
    //

    // compute one bit more for rounding
    div_wl ++;

    result.resize_to( sc_max( n_word( div_wl ) + 1, min_mant ) );
    result.m_mant.clear();
    result.m_sign = lhs.m_sign * rhs.m_sign;

    int msb_lhs = scfx_find_msb( lhs.m_mant[lhs.m_msw] )
	        + ( lhs.m_msw - lhs.m_wp ) * bits_in_word;
    int msb_rhs = scfx_find_msb( rhs.m_mant[rhs.m_msw] )
	        + ( rhs.m_msw - rhs.m_wp ) * bits_in_word;

    int msb_res = msb_lhs - msb_rhs;
    int to_shift = -msb_res % bits_in_word;
    int result_index;

    int c = ( msb_res % bits_in_word >= 0 ) ? 1 : 0;

    result_index = (result.size() - c) * bits_in_word + msb_res % bits_in_word;
    result.m_wp   = (result.size() - c) - msb_res / bits_in_word;

    scfx_rep remainder = lhs;

    // align msb from remainder to msb from rhs
    remainder.lshift( to_shift );

    // make sure msw( remainder ) < size - 1
    if( remainder.m_msw == remainder.size() - 1 )
	remainder.resize_to( remainder.size() + 1, 1 );

    // make sure msw( remainder ) >= msw( rhs )!
    int msw_diff = rhs.m_msw - remainder.m_msw;
    if (msw_diff > 0)
	remainder.resize_to( remainder.size() + msw_diff, -1 );

    int counter;

    for( counter = div_wl; counter && ! remainder.is_zero(); counter -- )
    {
	if( compare_msw_ff( rhs, remainder ) <= 0 )
	{
	    result.set_bin( result_index );
	    sub_with_index( remainder.m_mant, remainder.m_msw, remainder.m_lsw,
			    rhs.m_mant, rhs.m_msw, rhs.m_lsw );
	}
	result_index --;
	remainder.shift_left( 1 );
        remainder.m_lsw = remainder.find_lsw();
    }

    // perform convergent rounding, if needed
    if( counter == 0 )
    {
	int index = result_index + 1 - result.m_wp * bits_in_word;

	scfx_index x = result.calc_indices( index );
	scfx_index x1 = result.calc_indices( index + 1 );

	if( result.o_bit_at( x ) && result.o_bit_at( x1 ) )
	    result.q_incr( x );

	result.m_r_flag = true;
    }

    result.find_sw();

    return &result;
}